

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

int __thiscall SQLite::Statement::exec(Statement *this)

{
  int iVar1;
  int iVar2;
  Exception *pEVar3;
  int ret;
  Statement *this_local;
  
  iVar1 = tryExecuteStep(this);
  if (iVar1 == 0x65) {
    iVar1 = sqlite3_changes(this->mpSQLite);
    return iVar1;
  }
  if (iVar1 == 100) {
    pEVar3 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar3,"exec() does not expect results. Use executeStep.");
    __cxa_throw(pEVar3,&Exception::typeinfo,Exception::~Exception);
  }
  iVar2 = sqlite3_errcode(this->mpSQLite);
  if (iVar1 == iVar2) {
    pEVar3 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar3,this->mpSQLite,iVar1);
    __cxa_throw(pEVar3,&Exception::typeinfo,Exception::~Exception);
  }
  pEVar3 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(pEVar3,"Statement needs to be reseted",iVar1);
  __cxa_throw(pEVar3,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

int Statement::exec()
{
    const int ret = tryExecuteStep();
    if (SQLITE_DONE != ret) // the statement has finished executing successfully
    {
        if (SQLITE_ROW == ret)
        {
            throw SQLite::Exception("exec() does not expect results. Use executeStep.");
        }
        else if (ret == sqlite3_errcode(mpSQLite))
        {
            throw SQLite::Exception(mpSQLite, ret);
        }
        else
        {
            throw SQLite::Exception("Statement needs to be reseted", ret);
        }
    }

    // Return the number of rows modified by those SQL statements (INSERT, UPDATE or DELETE)
    return sqlite3_changes(mpSQLite);
}